

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Projection::Parse
               (IMkvReader *reader,longlong start,longlong size,Projection **projection)

{
  Projection *this;
  pointer pPVar1;
  long lVar2;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  longlong value_parse_status;
  double value;
  int status_1;
  uchar *data;
  longlong projection_type;
  longlong status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong end;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  longlong *in_stack_ffffffffffffff18;
  longlong *in_stack_ffffffffffffff20;
  longlong in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  IMkvReader *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  IMkvReader *in_stack_ffffffffffffff48;
  undefined1 local_1;
  
  if ((in_RDI == 0) || (*in_RCX != 0)) {
    local_1 = false;
  }
  else {
    this = (Projection *)operator_new(0x28);
    Projection(this);
    std::unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>>::
    unique_ptr<std::default_delete<mkvparser::Projection>,void>
              ((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (pointer)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    pPVar1 = std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
             get((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (pPVar1 == (pointer)0x0) {
      local_1 = false;
    }
    else if (in_RSI < in_RSI + in_RDX) {
      lVar2 = ParseElementHeader(in_stack_ffffffffffffff38,(longlong *)in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff18);
      if (lVar2 < 0) {
        local_1 = false;
      }
      else {
        lVar2 = UnserializeFloat(in_stack_ffffffffffffff48,
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                 (longlong)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        if (lVar2 < 0) {
          local_1 = false;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      pPVar1 = std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
               release((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                        *)0x1992df);
      *in_RCX = (long)pPVar1;
      local_1 = true;
    }
    std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::~unique_ptr
              ((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  return local_1;
}

Assistant:

bool Projection::Parse(IMkvReader* reader, long long start, long long size,
                       Projection** projection) {
  if (!reader || *projection)
    return false;

  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  const long long end = start + size;
  long long read_pos = start;

  while (read_pos < end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvProjectionType) {
      long long projection_type = kTypeNotPresent;
      projection_type = UnserializeUInt(reader, read_pos, child_size);
      if (projection_type < 0)
        return false;

      projection_ptr->type = static_cast<ProjectionType>(projection_type);
    } else if (child_id == libwebm::kMkvProjectionPrivate) {
      if (projection_ptr->private_data != NULL)
        return false;
      unsigned char* data = SafeArrayAlloc<unsigned char>(1, child_size);

      if (data == NULL)
        return false;

      const int status =
          reader->Read(read_pos, static_cast<long>(child_size), data);

      if (status) {
        delete[] data;
        return false;
      }

      projection_ptr->private_data = data;
      projection_ptr->private_data_length = static_cast<size_t>(child_size);
    } else {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      // Make sure value is representable as a float before casting.
      if (value_parse_status < 0 || value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }

      switch (child_id) {
        case libwebm::kMkvProjectionPoseYaw:
          projection_ptr->pose_yaw = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPosePitch:
          projection_ptr->pose_pitch = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPoseRoll:
          projection_ptr->pose_roll = static_cast<float>(value);
          break;
        default:
          return false;
      }
    }

    read_pos += child_size;
    if (read_pos > end)
      return false;
  }

  *projection = projection_ptr.release();
  return true;
}